

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

bool __thiscall gpu::Device::supportsFreeMemoryQuery(Device *this)

{
  const_iterator cVar1;
  DeviceInfo device_info;
  key_type local_150;
  DeviceInfo local_130;
  
  if (this->supports_opencl == true) {
    ocl::DeviceInfo::DeviceInfo(&local_130);
    ocl::DeviceInfo::init(&local_130,(EVP_PKEY_CTX *)this->device_id_opencl);
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"cl_amd_device_attribute_query","");
    cVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_130.extensions._M_t,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_130.extensions._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.platform_version._M_dataplus._M_p != &local_130.platform_version.field_2) {
      operator_delete(local_130.platform_version._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.driver_version._M_dataplus._M_p != &local_130.driver_version.field_2) {
      operator_delete(local_130.driver_version._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.vendor_name._M_dataplus._M_p != &local_130.vendor_name.field_2) {
      operator_delete(local_130.vendor_name._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.device_name._M_dataplus._M_p != &local_130.device_name.field_2) {
      operator_delete(local_130.device_name._M_dataplus._M_p);
    }
    if ((_Rb_tree_header *)cVar1._M_node != &local_130.extensions._M_t._M_impl.super__Rb_tree_header
       ) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Device::supportsFreeMemoryQuery() const
{
#ifdef CUDA_SUPPORT
	if (supports_cuda) {
		return true;
	} else
#endif
	if (supports_opencl) {
		ocl::DeviceInfo device_info;
		device_info.init(device_id_opencl);
		if (device_info.hasExtension(CL_AMD_DEVICE_ATTRIBUTE_QUERY_EXT)) {
			return true;
		}
	}

	return false;
}